

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::DelocalizeRadix(char *buffer)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  char *in_RDI;
  char *target;
  char *local_8;
  
  pcVar3 = strchr(in_RDI,0x2e);
  local_8 = in_RDI;
  if (pcVar3 == (char *)0x0) {
    while (bVar1 = IsValidFloatChar(*local_8), bVar1) {
      local_8 = local_8 + 1;
    }
    if (*local_8 != '\0') {
      *local_8 = '.';
      pcVar3 = local_8 + 1;
      bVar1 = IsValidFloatChar(*pcVar3);
      if ((!bVar1) && (local_8 = pcVar3, *pcVar3 != '\0')) {
        do {
          local_8 = local_8 + 1;
          bVar2 = IsValidFloatChar(*local_8);
          bVar1 = false;
          if (!bVar2) {
            bVar1 = *local_8 != '\0';
          }
        } while (bVar1);
        sVar4 = strlen(local_8);
        memmove(pcVar3,local_8,sVar4 + 1);
      }
    }
  }
  return;
}

Assistant:

void DelocalizeRadix(char* buffer) {
  // Fast check:  if the buffer has a normal decimal point, assume no
  // translation is needed.
  if (strchr(buffer, '.') != nullptr) return;

  // Find the first unknown character.
  while (IsValidFloatChar(*buffer)) ++buffer;

  if (*buffer == '\0') {
    // No radix character found.
    return;
  }

  // We are now pointing at the locale-specific radix character.  Replace it
  // with '.'.
  *buffer = '.';
  ++buffer;

  if (!IsValidFloatChar(*buffer) && *buffer != '\0') {
    // It appears the radix was a multi-byte character.  We need to remove the
    // extra bytes.
    char* target = buffer;
    do { ++buffer; } while (!IsValidFloatChar(*buffer) && *buffer != '\0');
    memmove(target, buffer, strlen(buffer) + 1);
  }
}